

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestPrinters.cpp
# Opt level: O3

void anon_unknown.dwarf_3d0d5c::logClock(SessionWriter *writer,uint64_t clock)

{
  pthread_mutex_t *__mutex;
  __atomic_base<unsigned_long> _Var1;
  int iVar2;
  size_t sVar3;
  undefined8 uVar4;
  char local_f2 [2];
  uint64_t local_f0;
  undefined1 local_e8 [16];
  _Alloc_hider local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  _Alloc_hider local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  _Alloc_hider local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  uint64_t local_78;
  _Alloc_hider local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  _Alloc_hider local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  local_f0 = clock;
  if (logClock::_binlog_sid.super___atomic_base<unsigned_long>._M_i == 0) {
    __mutex = (pthread_mutex_t *)writer->_session;
    local_e8._0_8_ = 0;
    local_e8._8_2_ = info;
    local_d8._M_p = (pointer)&local_c8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"main","");
    local_b8._M_p = (pointer)&local_a8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"logClock","");
    local_98._M_p = (pointer)&local_88;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_98,
               "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/binlog/TestPrinters.cpp"
               ,"");
    local_78 = 0x1c;
    local_70._M_p = (pointer)&local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"{}","");
    local_f2[0] = 'L';
    local_f2[1] = '\0';
    local_50._M_p = (pointer)&local_40;
    sVar3 = strlen(local_f2);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,local_f2,local_f2 + sVar3);
    iVar2 = pthread_mutex_lock(__mutex);
    if (iVar2 != 0) {
      uVar4 = std::__throw_system_error(iVar2);
      pthread_mutex_unlock(__mutex);
      binlog::EventSource::~EventSource((EventSource *)local_e8);
      _Unwind_Resume(uVar4);
    }
    local_e8._0_8_ = __mutex[3].__align;
    binlog::
    serializeSizePrefixedTagged<binlog::EventSource,binlog::detail::RecoverableVectorOutputStream>
              ((EventSource *)local_e8,(RecoverableVectorOutputStream *)((long)__mutex + 0x58));
    _Var1._M_i = __mutex[3].__align;
    __mutex[3].__align = _Var1._M_i + 1;
    pthread_mutex_unlock(__mutex);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_p != &local_40) {
      operator_delete(local_50._M_p,local_40._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_p != &local_60) {
      operator_delete(local_70._M_p,local_60._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_p != &local_88) {
      operator_delete(local_98._M_p,local_88._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_p != &local_a8) {
      operator_delete(local_b8._M_p,local_a8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_p != &local_c8) {
      operator_delete(local_d8._M_p,local_c8._M_allocated_capacity + 1);
    }
    LOCK();
    UNLOCK();
    logClock::_binlog_sid.super___atomic_base<unsigned_long>._M_i =
         (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var1._M_i;
  }
  binlog::SessionWriter::addEvent<unsigned_long&>
            (writer,(uint64_t)logClock::_binlog_sid.super___atomic_base<unsigned_long>._M_i,clock,
             &local_f0);
  return;
}

Assistant:

void logClock(binlog::SessionWriter& writer, std::uint64_t clock)
{
  BINLOG_CREATE_SOURCE_AND_EVENT(writer, binlog::Severity::info, main, clock, "{}", clock);
}